

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshalling.cc
# Opt level: O0

bool __thiscall
absl::lts_20240722::flags_internal::AbslParseFlag
          (flags_internal *this,string_view text,bool *dst,string *param_3)

{
  string_view str;
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  size_t local_e0;
  char *local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  size_t local_c0;
  char *local_b8;
  ulong local_b0;
  size_t i;
  char *local_a0;
  string_view local_98;
  undefined8 local_88;
  char *kFalse [5];
  char *local_58;
  char *kTrue [5];
  string *param_2_local;
  bool *dst_local;
  string_view text_local;
  
  kTrue[4] = dst;
  memcpy(&local_58,&DAT_0011dc70,0x28);
  memcpy(&local_88,&PTR_anon_var_dwarf_8e_0011dca0,0x28);
  str._M_str = (char *)text._M_len;
  str._M_len = (size_t)this;
  i = (size_t)this;
  local_a0 = (char *)text._M_len;
  local_98 = StripAsciiWhitespace(str);
  sVar1 = local_98._M_len;
  pcVar2 = local_98._M_str;
  local_b0 = 0;
  while( true ) {
    if (4 < local_b0) {
      return false;
    }
    local_c0 = sVar1;
    local_b8 = pcVar2;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_d0,kTrue[local_b0 - 1]);
    uVar3 = absl::lts_20240722::EqualsIgnoreCase(local_c0,local_b8,local_d0._M_len,local_d0._M_str);
    if ((uVar3 & 1) != 0) break;
    local_e0 = sVar1;
    local_d8 = pcVar2;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_f0,kFalse[local_b0 - 1]);
    uVar3 = absl::lts_20240722::EqualsIgnoreCase(local_e0,local_d8,local_f0._M_len,local_f0._M_str);
    if ((uVar3 & 1) != 0) {
      *text._M_str = '\0';
      return true;
    }
    local_b0 = local_b0 + 1;
  }
  *text._M_str = '\x01';
  return true;
}

Assistant:

bool AbslParseFlag(absl::string_view text, bool* dst, std::string*) {
  const char* kTrue[] = {"1", "t", "true", "y", "yes"};
  const char* kFalse[] = {"0", "f", "false", "n", "no"};
  static_assert(sizeof(kTrue) == sizeof(kFalse), "true_false_equal");

  text = absl::StripAsciiWhitespace(text);

  for (size_t i = 0; i < ABSL_ARRAYSIZE(kTrue); ++i) {
    if (absl::EqualsIgnoreCase(text, kTrue[i])) {
      *dst = true;
      return true;
    } else if (absl::EqualsIgnoreCase(text, kFalse[i])) {
      *dst = false;
      return true;
    }
  }
  return false;  // didn't match a legal input
}